

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portaldata.cpp
# Opt level: O2

void Cmd_dumpportals(FCommandLine *argv,APlayerPawn *who,int key)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  undefined8 *puVar5;
  subsector_t *psVar6;
  subsector_t *psVar7;
  long lVar8;
  int l;
  long lVar9;
  ulong uVar10;
  uint m;
  ulong uVar11;
  uint k;
  ulong uVar12;
  long lVar13;
  
  for (uVar10 = 0; uVar10 < portals.Count; uVar10 = uVar10 + 1) {
    dVar1 = (portals.Array[uVar10]->mDisplacement).X;
    dVar2 = (portals.Array[uVar10]->mDisplacement).Y;
    Printf(5,"Portal #%d, %s, displacement = (%f,%f)\n",uVar10 & 0xffffffff);
    Printf(5,"Coverage:\n");
    for (lVar8 = 0; psVar6 = subsectors, lVar8 < numsubsectors; lVar8 = lVar8 + 1) {
      if ((subsectors[lVar8].render_sector)->portals[portals.Array[uVar10]->plane] ==
          portals.Array[uVar10]) {
        Printf(5,"\tSubsector %d (%d):\n\t\t",lVar8,
               (ulong)(uint)(subsectors[lVar8].render_sector)->sectornum);
        lVar9 = 0;
        for (uVar12 = 0; uVar12 < psVar6[lVar8].numlines; uVar12 = uVar12 + 1) {
          pdVar4 = *(double **)((long)&(psVar6[lVar8].firstline)->v1 + lVar9);
          Printf(5,"(%.3f,%.3f), ",*pdVar4 + dVar1,pdVar4[1] + dVar2);
          lVar9 = lVar9 + 0x48;
        }
        Printf(5,"\n\t\tCovered by subsectors:\n");
        iVar3 = portals.Array[uVar10]->plane;
        for (lVar9 = 0; psVar7 = subsectors, lVar9 < psVar6[lVar8].portalcoverage[iVar3].sscount;
            lVar9 = lVar9 + 1) {
          uVar12 = (ulong)psVar6[lVar8].portalcoverage[iVar3].subsectors[lVar9];
          Printf(5,"\t\t\t%5d (%4d): ",uVar12,
                 (ulong)(uint)(subsectors[uVar12].render_sector)->sectornum);
          lVar13 = 0;
          for (uVar11 = 0; uVar11 < psVar7[uVar12].numlines; uVar11 = uVar11 + 1) {
            puVar5 = *(undefined8 **)((long)&(psVar7[uVar12].firstline)->v1 + lVar13);
            Printf(5,"(%.3f,%.3f), ",*puVar5,puVar5[1]);
            lVar13 = lVar13 + 0x48;
          }
          Printf(5,"\n");
        }
      }
    }
  }
  return;
}

Assistant:

CCMD(dumpportals)
{
	for(unsigned i=0;i<portals.Size(); i++)
	{
		double xdisp = portals[i]->mDisplacement.X;
		double ydisp = portals[i]->mDisplacement.Y;
		Printf(PRINT_LOG, "Portal #%d, %s, displacement = (%f,%f)\n", i, portals[i]->plane==0? "floor":"ceiling",
			xdisp, ydisp);
		Printf(PRINT_LOG, "Coverage:\n");
		for(int j=0;j<numsubsectors;j++)
		{
			subsector_t *sub = &subsectors[j];
			FPortal *port = sub->render_sector->GetGLPortal(portals[i]->plane);
			if (port == portals[i])
			{
				Printf(PRINT_LOG, "\tSubsector %d (%d):\n\t\t", j, sub->render_sector->sectornum);
				for(unsigned k = 0;k< sub->numlines; k++)
				{
					Printf(PRINT_LOG, "(%.3f,%.3f), ",	sub->firstline[k].v1->fX() + xdisp, sub->firstline[k].v1->fY() + ydisp);
				}
				Printf(PRINT_LOG, "\n\t\tCovered by subsectors:\n");
				FPortalCoverage *cov = &sub->portalcoverage[portals[i]->plane];
				for(int l = 0;l< cov->sscount; l++)
				{
					subsector_t *csub = &subsectors[cov->subsectors[l]];
					Printf(PRINT_LOG, "\t\t\t%5d (%4d): ", cov->subsectors[l], csub->render_sector->sectornum);
					for(unsigned m = 0;m< csub->numlines; m++)
					{
						Printf(PRINT_LOG, "(%.3f,%.3f), ",	csub->firstline[m].v1->fX(), csub->firstline[m].v1->fY());
					}
					Printf(PRINT_LOG, "\n");
				}
			}
		}
	}
}